

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O0

void __thiscall
Centaurus::ChaserEM64T<char>::ChaserEM64T
          (ChaserEM64T<char> *this,Grammar<char> *grammar,Logger *logger,ErrorHandler *errhandler)

{
  CodeHolder *this_00;
  ErrorHandler *errhandler_local;
  Logger *logger_local;
  Grammar<char> *grammar_local;
  ChaserEM64T<char> *this_local;
  
  IChaser::IChaser(&this->super_IChaser);
  (this->super_IChaser)._vptr_IChaser = (_func_int **)&PTR__ChaserEM64T_0028a2a8;
  this_00 = (CodeHolder *)&this->m_runtime;
  asmjit::JitRuntime::JitRuntime((JitRuntime *)this_00);
  asmjit::CodeHolder::CodeHolder(this_00);
  std::
  unordered_map<Centaurus::Identifier,_void_*(*)(void_*,_const_void_*),_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_void_*(*)(void_*,_const_void_*)>_>_>
  ::unordered_map(&this->m_funcmap);
  std::vector<void_*(*)(void_*,_const_void_*),_std::allocator<void_*(*)(void_*,_const_void_*)>_>::
  vector(&this->m_funcarray);
  init(this,(EVP_PKEY_CTX *)grammar);
  return;
}

Assistant:

ChaserEM64T<TCHAR>::ChaserEM64T(const Grammar<TCHAR>& grammar, asmjit::Logger *logger, asmjit::ErrorHandler *errhandler)
{
    init(grammar, logger, errhandler);
}